

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

uint __thiscall Executor::calculateRank(Executor *this,Values *values)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  puVar1 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    uVar4 = (ulong)uVar3;
    if ((ulong)((long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <= uVar4)
    break;
    iVar5 = puVar1[uVar4] -
            (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar4];
    iVar6 = -iVar5;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    uVar2 = uVar2 + iVar6;
    uVar3 = uVar3 + 1;
  }
  return uVar2;
}

Assistant:

unsigned int Executor::calculateRank(const Values& values) const noexcept
{
    unsigned int rank = 0u;

    for (unsigned int i = 0; i < values.size(); i++)
    {
        const int a = values[i] - m_desired[i];
        rank += std::abs(a);
    }

    return rank;
}